

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetUsageString(USAGE Usage)

{
  char *pcVar1;
  string msg;
  string local_30;
  
  if (GetUsageString(Diligent::USAGE)::UsageStrings == '\0') {
    GetUsageString();
  }
  if (Usage < USAGE_NUM_USAGES) {
    pcVar1 = GetUsageString::UsageStrings.UsageStrings._M_elems[Usage];
  }
  else {
    pcVar1 = "Unknown usage";
    FormatString<char[14]>(&local_30,(char (*) [14])"Unknown usage");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x453);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar1;
}

Assistant:

const Char* GetUsageString(USAGE Usage)
{
    struct UsageToStringMap
    {
        UsageToStringMap()
        {
#define INIT_USAGE_STR(Usage) UsageStrings[Usage] = #Usage
            INIT_USAGE_STR(USAGE_IMMUTABLE);
            INIT_USAGE_STR(USAGE_DEFAULT);
            INIT_USAGE_STR(USAGE_DYNAMIC);
            INIT_USAGE_STR(USAGE_STAGING);
            INIT_USAGE_STR(USAGE_UNIFIED);
            INIT_USAGE_STR(USAGE_SPARSE);
#undef INIT_USAGE_STR
            static_assert(USAGE_NUM_USAGES == 6, "Please update the map to handle the new usage type");
        }

        const Char* operator[](USAGE Usage) const
        {
            if (Usage >= USAGE_IMMUTABLE && Usage < USAGE_NUM_USAGES)
                return UsageStrings[Usage];
            else
            {
                UNEXPECTED("Unknown usage");
                return "Unknown usage";
            }
        }

    private:
        std::array<const Char*, USAGE_NUM_USAGES> UsageStrings{};
    };

    static const UsageToStringMap UsageStrings;
    return UsageStrings[Usage];
}